

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O1

bool __thiscall google::protobuf::internal::MapTypeCard::is_utf8(MapTypeCard *this)

{
  byte bVar1;
  char *pcVar2;
  ParseContext *ctx;
  char *in_RSI;
  undefined1 *puVar3;
  long in_R8;
  undefined1 local_10 [16];
  
  bVar1 = this->data_;
  if ((bVar1 & 7) == 2) {
    if ((bVar1 & 0x38) == 0x18) {
      return (bool)((bVar1 & 0x40) >> 6);
    }
  }
  else {
    is_utf8();
  }
  puVar3 = local_10;
  is_utf8();
  if (((ulong)(puVar3 + *(ushort *)(in_R8 + 2)) & 7) == 0) {
    pcVar2 = ExtensionSet::ParseMessageSet<google::protobuf::MessageLite>
                       ((ExtensionSet *)(puVar3 + *(ushort *)(in_R8 + 2)),in_RSI,
                        (MessageLite *)**(undefined8 **)(in_R8 + 0x20),
                        (InternalMetadata *)(puVar3 + 8),ctx);
    return SUB81(pcVar2,0);
  }
  AlignFail();
}

Assistant:

bool is_utf8() const {
    ABSL_DCHECK(wiretype() == WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    ABSL_DCHECK(cpp_type() == CppType::kString);
    return is_zigzag_utf8();
  }